

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O2

void websocket_on_pubsub_message_direct_internal(fio_msg_s *msg,uint8_t txt)

{
  void *uuid;
  fio_write_args_s options;
  ws_s *ws;
  int *piVar1;
  void *o;
  size_t sVar2;
  fio_str_s local_68;
  fio_str_info_s s;
  
  ws = (ws_s *)fio_protocol_try_lock((intptr_t)msg->udata1,FIO_PR_LOCK_WRITE);
  if (ws != (ws_s *)0x0) {
    if ((ws->is_client == '\0') &&
       (o = fio_message_metadata(msg,(ulong)txt - 0x22), o != (void *)0x0)) {
      uuid = msg->udata1;
      if ((~(uint)o & 6) != 0 && ((ulong)o & 1) == 0) {
        LOCK();
        piVar1 = (int *)(((ulong)o & 0xfffffffffffffff8) + 4);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      fiobj_obj2cstr(&s,(FIOBJ)o);
      local_68._4_4_ = SUB84((ulong)o >> 0x20,0);
      local_68.reserved[2] = '7';
      local_68.reserved[3] = 0xfe;
      local_68.reserved[4] = '\x14';
      local_68.reserved[5] = '\0';
      local_68.reserved[6] = '\0';
      local_68.reserved[7] = '\0';
      local_68.reserved[8] = '\0';
      local_68.reserved[9] = '\0';
      local_68.capa._0_4_ = (undefined4)s.len;
      local_68.capa._4_4_ = (undefined4)(s.len >> 0x20);
      local_68.len = (long)s.data - (long)o;
      local_68.dealloc = (_func_void_void_ptr *)((ulong)local_68.dealloc & 0xffffffffffffff00);
      options.after.dealloc = fiobj4sock_dealloc;
      options.data.buffer = o;
      options.length = s.len;
      options.offset = local_68.len;
      options._32_8_ = local_68.dealloc;
      local_68.ref = (uint)o;
      fio_write2_fn((intptr_t)uuid,options);
    }
    else {
      if (txt == '\x02') {
        local_68.ref = 0;
        local_68.small = '\0';
        local_68.frozen = '\0';
        local_68.reserved[0] = '\0';
        local_68.reserved[1] = '\0';
        local_68.reserved[2] = '\0';
        local_68.reserved[3] = '\0';
        local_68.reserved[4] = '\0';
        local_68.reserved[5] = '\0';
        local_68.reserved[6] = '\0';
        local_68.reserved[7] = '\0';
        local_68.reserved[8] = '\0';
        local_68.reserved[9] = '\0';
        local_68.capa._0_4_ = 0;
        local_68.capa._4_4_ = 0;
        local_68.len = (msg->msg).len;
        local_68.dealloc = (_func_void_void_ptr *)0x0;
        local_68.data = (msg->msg).data;
        if (local_68.len < 0x8000) {
          sVar2 = fio_str_utf8_valid(&local_68);
          txt = (uint8_t)sVar2;
        }
        else {
          txt = 0;
        }
      }
      websocket_write(ws,msg->msg,txt & 1);
    }
    fio_protocol_unlock((fio_protocol_s *)ws,FIO_PR_LOCK_WRITE);
    return;
  }
  piVar1 = __errno_location();
  if (*piVar1 == 9) {
    return;
  }
  fio_message_defer(msg);
  return;
}

Assistant:

static inline void websocket_on_pubsub_message_direct_internal(fio_msg_s *msg,
                                                               uint8_t txt) {
  fio_protocol_s *pr =
      fio_protocol_try_lock((intptr_t)msg->udata1, FIO_PR_LOCK_WRITE);
  if (!pr) {
    if (errno == EBADF)
      return;
    fio_message_defer(msg);
    return;
  }
  FIOBJ message = FIOBJ_INVALID;
  FIOBJ pre_wrapped = FIOBJ_INVALID;
  if (!((ws_s *)pr)->is_client) {
    /* pre-wrapping is only for client data */
    switch (txt) {
    case 0:
      pre_wrapped =
          (FIOBJ)fio_message_metadata(msg, WEBSOCKET_OPTIMIZE_PUBSUB_BINARY);
      break;
    case 1:
      pre_wrapped =
          (FIOBJ)fio_message_metadata(msg, WEBSOCKET_OPTIMIZE_PUBSUB_TEXT);
      break;
    case 2:
      pre_wrapped = (FIOBJ)fio_message_metadata(msg, WEBSOCKET_OPTIMIZE_PUBSUB);
      break;
    default:
      break;
    }
    if (pre_wrapped) {
      // FIO_LOG_DEBUG(
      //     "pub/sub WebSocket optimization route for pre-wrapped message.");
      fiobj_send_free((intptr_t)msg->udata1, fiobj_dup(pre_wrapped));
      goto finish;
    }
  }
  if (txt == 2) {
    /* unknown text state */
    fio_str_s tmp =
        FIO_STR_INIT_STATIC2(msg->msg.data, msg->msg.len); // don't free
    txt = (tmp.len >= (2 << 14) ? 0 : fio_str_utf8_valid(&tmp));
  }
  websocket_write((ws_s *)pr, msg->msg, txt & 1);
  fiobj_free(message);
finish:
  fio_protocol_unlock(pr, FIO_PR_LOCK_WRITE);
}